

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_ref.cpp
# Opt level: O3

bool __thiscall duckdb::ColumnDataRef::Equals(ColumnDataRef *this,TableRef *other_p)

{
  bool bVar1;
  ColumnDataRef *pCVar2;
  ColumnDataCollection *pCVar3;
  reference this_00;
  reference rhs;
  const_reference l1;
  const_reference l2;
  type left;
  type right;
  size_type __n;
  vector<duckdb::LogicalType,_true> expected_types;
  vector<duckdb::LogicalType,_true> other_expected_types;
  string unused;
  vector<duckdb::LogicalType,_true> local_90;
  shared_ptr<duckdb::ColumnDataCollection,_true> *local_78;
  shared_ptr<duckdb::ColumnDataCollection,_true> *local_70;
  vector<duckdb::LogicalType,_true> local_68;
  string local_50;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pCVar2 = TableRef::Cast<duckdb::ColumnDataRef>(other_p);
    local_70 = &this->collection;
    pCVar3 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(local_70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_90,
               &(pCVar3->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    local_78 = &pCVar2->collection;
    pCVar3 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(local_78);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
               &(pCVar3->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    if (((long)local_90.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_90.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start ==
         (long)local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start) &&
       ((long)(this->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(pCVar2->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pCVar2->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      if (local_90.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_90.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          this_00 = vector<duckdb::LogicalType,_true>::operator[](&local_90,__n);
          rhs = vector<duckdb::LogicalType,_true>::operator[](&local_68,__n);
          l1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&this->expected_names,__n);
          l2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&pCVar2->expected_names,__n);
          bVar1 = LogicalType::operator==(this_00,rhs);
          if (!bVar1) goto LAB_0125b404;
          bVar1 = StringUtil::CIEquals(l1,l2);
          if (!bVar1) goto LAB_0125b404;
          __n = __n + 1;
        } while (__n < (ulong)(((long)local_90.
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_90.
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
      }
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      left = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*(local_70);
      right = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*(local_78);
      bVar1 = ColumnDataCollection::ResultEquals(left,right,&local_50,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    else {
LAB_0125b404:
      bVar1 = false;
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_90);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ColumnDataRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<ColumnDataRef>();
	auto expected_types = collection->Types();
	auto other_expected_types = other.collection->Types();
	if (expected_types.size() != other_expected_types.size()) {
		return false;
	}
	if (expected_names.size() != other.expected_names.size()) {
		return false;
	}
	D_ASSERT(expected_types.size() == expected_names.size());
	for (idx_t i = 0; i < expected_types.size(); i++) {
		auto &this_type = expected_types[i];
		auto &other_type = other_expected_types[i];

		auto &this_name = expected_names[i];
		auto &other_name = other.expected_names[i];

		if (this_type != other_type) {
			return false;
		}
		if (!StringUtil::CIEquals(this_name, other_name)) {
			return false;
		}
	}
	string unused;
	if (!ColumnDataCollection::ResultEquals(*collection, *other.collection, unused, true)) {
		return false;
	}
	return true;
}